

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O2

void __thiscall
argh::stringstream_proxy::stringstream_proxy(stringstream_proxy *this,stringstream_proxy *other)

{
  string asStack_38 [32];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::istringstream::istringstream((istringstream *)this,asStack_38,_S_in);
  std::__cxx11::string::~string(asStack_38);
  std::ios::setstate((int)*(undefined8 *)(*(long *)this + -0x18) + (int)this);
  return;
}

Assistant:

stringstream_proxy(const stringstream_proxy& other) :
         stream_(other.stream_.str())
      {
         stream_.setstate(other.stream_.rdstate());
      }